

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O2

void __thiscall MyCompiler::Statement::Statement(Statement *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Statement",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->vStatement).
  super__Vector_base<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vStatement).
  super__Vector_base<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vIdent).super__Vector_base<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vStatement).
  super__Vector_base<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vIdent).super__Vector_base<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vIdent).super__Vector_base<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pStatement).super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pStatement).super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pCondition).super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pCondition).super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pExpression).super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->pExpression).super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pIdent).super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pIdent).super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

MyCompiler::Statement::Statement()
        : AbstractAstNode("Statement")
{}